

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

uint8_t argumentList(void)

{
  uint8_t uVar1;
  char cVar2;
  
  if (parser.current.type == TOKEN_RIGHT_PAREN) {
    uVar1 = '\0';
  }
  else {
    cVar2 = -1;
    while( true ) {
      parsePrecedence(PREC_ASSIGNMENT);
      if (cVar2 == '\0') {
        errorAt(&parser.previous,"Cannot have more than 255 arguments.");
      }
      if (parser.current.type != TOKEN_COMMA) break;
      advance();
      cVar2 = cVar2 + -1;
    }
    uVar1 = -cVar2;
  }
  if (parser.current.type == TOKEN_RIGHT_PAREN) {
    advance();
  }
  else {
    errorAt(&parser.current,"Expect \')\' after arguments.");
  }
  return uVar1;
}

Assistant:

static uint8_t argumentList() {
    uint8_t argCount = 0;
    if (!check(TOKEN_RIGHT_PAREN)) {
        do {
            expression();

            if (argCount == PARAMS_MAX) {
                error("Cannot have more than 255 arguments.");
            }

            argCount++;
        } while (match(TOKEN_COMMA));
    }

    consume(TOKEN_RIGHT_PAREN, "Expect ')' after arguments.");
    return argCount;
}